

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O0

bool __thiscall
TPathFragmentTable::CompareAndCopyPathFragment
          (TPathFragmentTable *this,TMndxSearch *pSearch,size_t nFragmentOffset)

{
  TStruct40 *pTVar1;
  bool bVar2;
  TStruct40 *index;
  char *pcVar3;
  TStruct40 *pStruct40;
  size_t nFragmentOffset_local;
  TMndxSearch *pSearch_local;
  TPathFragmentTable *this_local;
  
  pTVar1 = pSearch->pStruct40;
  bVar2 = TSparseArray::IsEmpty(&this->PathMarks);
  pStruct40 = (TStruct40 *)nFragmentOffset;
  if (bVar2) {
    while ((ulong)pTVar1->PathLength < pSearch->cchSearchMask) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      if (*pcVar3 != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      index = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,*pcVar3);
      pTVar1->PathLength = pTVar1->PathLength + 1;
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)index);
      pStruct40 = index;
      if (*pcVar3 == '\0') {
        return true;
      }
    }
    while (pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40),
          *pcVar3 != '\0') {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,*pcVar3);
      pStruct40 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
    }
  }
  else {
    while (pStruct40 < (TStruct40 *)pSearch->cchSearchMask) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      if (*pcVar3 != pSearch->szSearchMask[pTVar1->PathLength]) {
        return false;
      }
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,*pcVar3);
      pTVar1->PathLength = pTVar1->PathLength + 1;
      bVar2 = TSparseArray::IsItemPresent(&this->PathMarks,(size_t)pStruct40);
      pStruct40 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
      if (bVar2) {
        return true;
      }
    }
    while (bVar2 = TSparseArray::IsItemPresent(&this->PathMarks,(size_t)pStruct40),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar3 = TGenericArray<char>::operator[](&this->PathFragments,(size_t)pStruct40);
      TGenericArray<char>::Insert(&pTVar1->PathBuffer,*pcVar3);
      pStruct40 = (TStruct40 *)((long)&(pStruct40->PathStops).ItemArray + 1);
    }
  }
  return true;
}

Assistant:

bool CompareAndCopyPathFragment(TMndxSearch * pSearch, size_t nFragmentOffset)
    {
        TStruct40 * pStruct40 = pSearch->pStruct40;

        // Do we have path fragment separators in an external structure?
        if(PathMarks.IsEmpty())
        {
            // Keep copying as long as we don't reach the end of the search mask
            while(pStruct40->PathLength < pSearch->cchSearchMask)
            {
                // HOTS: 195A5A0
                if(PathFragments[nFragmentOffset] != pSearch->szSearchMask[pStruct40->PathLength])
                    return false;

                // HOTS: 195A5B7
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
                pStruct40->PathLength++;

                // If we found the end of the fragment, return success
                if(PathFragments[nFragmentOffset] == 0)
                    return true;
            }

            // HOTS: 195A660
            // Now we need to copy the rest of the fragment
            while(PathFragments[nFragmentOffset] != 0)
            {
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset]);
                nFragmentOffset++;
            }
        }
        else
        {
            // Keep copying as long as we don't reach the end of the search mask
            while(nFragmentOffset < pSearch->cchSearchMask)
            {
                if(PathFragments[nFragmentOffset] != pSearch->szSearchMask[pStruct40->PathLength])
                    return false;

                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset]);
                pStruct40->PathLength++;

                // If we found the end of the fragment, return success
                if(PathMarks.IsItemPresent(nFragmentOffset++))
                    return true;
            }

            // Now we need to copy the rest of the fragment
            while(!PathMarks.IsItemPresent(nFragmentOffset))
            {
                // HOTS: 195A7A6
                pStruct40->PathBuffer.Insert(PathFragments[nFragmentOffset++]);
            }
        }

        return true;
    }